

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_MON_HEAL_HP(effect_handler_context_t *context)

{
  byte *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster *mon;
  short sVar4;
  char *fmt;
  char m_name [80];
  char m_poss [80];
  char acStack_c8 [80];
  char local_78 [88];
  
  if ((context->origin).what != SRC_MONSTER) {
    __assert_fail("context->origin.what == SRC_MONSTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-attack.c"
                  ,0x100,"_Bool effect_handler_MON_HEAL_HP(effect_handler_context_t *)");
  }
  wVar3 = (context->origin).which.monster;
  if (wVar3 < L'\x01') {
    effect_calculate_value((effect_handler_context_t_conflict *)context,false);
    return true;
  }
  mon = cave_monster(cave,wVar3);
  wVar3 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  if (mon == (monster *)0x0) {
    return true;
  }
  monster_desc(acStack_c8,0x50,mon,L'̔');
  monster_desc(local_78,0x50,mon,L'\"');
  if (player->timed[2] == 0) {
    _Var2 = monster_is_visible(mon);
    sVar4 = (short)wVar3 + mon->hp;
    mon->hp = sVar4;
    if (sVar4 < mon->maxhp) {
      if (_Var2) {
        fmt = "%s looks healthier.";
        goto LAB_001395ae;
      }
      goto LAB_0013958c;
    }
    mon->hp = mon->maxhp;
    if (_Var2) {
      fmt = "%s looks REALLY healthy!";
      goto LAB_001395ae;
    }
  }
  else {
    sVar4 = (short)wVar3 + mon->hp;
    mon->hp = sVar4;
    if (sVar4 < mon->maxhp) {
LAB_0013958c:
      fmt = "%s sounds healthier.";
      goto LAB_001395ae;
    }
    mon->hp = mon->maxhp;
  }
  fmt = "%s sounds REALLY healthy!";
LAB_001395ae:
  msg(fmt,acStack_c8);
  if (player->upkeep->health_who == mon) {
    pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if (mon->m_timed[3] != 0) {
    mon_clear_timed(mon,L'\x03',L'\x04');
    msg("%s recovers %s courage.",acStack_c8,local_78);
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_MON_HEAL_HP(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int midx = context->origin.which.monster;
	struct monster *mon = midx > 0 ? cave_monster(cave, midx) : NULL;

	int amount = effect_calculate_value(context, false);
	char m_name[80], m_poss[80];
	bool seen;

	if (!mon) return true;

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the monster possessive ("his"/"her"/"its") */
	monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

	seen = (!player->timed[TMD_BLIND] && monster_is_visible(mon));

	/* Heal some */
	mon->hp += amount;

	/* Fully healed */
	if (mon->hp >= mon->maxhp) {
		mon->hp = mon->maxhp;

		if (seen)
			msg("%s looks REALLY healthy!", m_name);
		else
			msg("%s sounds REALLY healthy!", m_name);
	} else if (seen) { /* Partially healed */
		msg("%s looks healthier.", m_name);
	} else {
		msg("%s sounds healthier.", m_name);
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Cancel fear */
	if (mon->m_timed[MON_TMD_FEAR]) {
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		msg("%s recovers %s courage.", m_name, m_poss);
	}

	/* ID */
	context->ident = true;

	return true;
}